

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5AsciiTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                     _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 **p;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  char aFold [64];
  int local_ac;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = &local_78;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_ac = 0x40;
  iVar11 = 0;
  iVar3 = 0;
  do {
    if ((nText <= iVar11) || (iVar3 != 0)) break;
    lVar4 = 0;
    do {
      if (((long)pText[lVar4 + iVar11] < 0) ||
         (pTokenizer[pText[lVar4 + iVar11]] != (Fts5Tokenizer)0x0)) {
        iVar3 = iVar11 + (int)lVar4;
        break;
      }
      lVar4 = lVar4 + 1;
      iVar3 = nText;
    } while ((long)nText - (long)iVar11 != lVar4);
    iVar11 = iVar3;
    iVar3 = 0;
    if (iVar11 == nText) {
      bVar2 = false;
    }
    else {
      iVar3 = iVar11 + 1;
      iVar10 = iVar11;
      iVar7 = iVar3;
      if (iVar3 < nText) {
        pcVar5 = pText + iVar3;
        lVar4 = 0;
        do {
          if ((-1 < (long)*pcVar5) && (pTokenizer[*pcVar5] == (Fts5Tokenizer)0x0)) {
            iVar10 = iVar11 - (int)lVar4;
            iVar7 = iVar3 - (int)lVar4;
            break;
          }
          lVar4 = lVar4 + -1;
          pcVar5 = pcVar5 + 1;
          iVar10 = nText + -1;
          iVar7 = nText;
        } while ((long)iVar3 - (long)nText != lVar4);
      }
      uVar9 = iVar7 - iVar11;
      if (local_ac < (int)uVar9) {
        if (p != &local_78) {
          sqlite3_free(p);
        }
        iVar3 = sqlite3_initialize();
        if (iVar3 == 0) {
          p = (undefined1 **)sqlite3Malloc((ulong)uVar9 * 2);
        }
        else {
          p = (undefined1 **)0x0;
        }
        if (p == (undefined1 **)0x0) {
          iVar3 = 7;
          p = (undefined1 **)0x0;
          bVar2 = false;
          goto LAB_001f4ce8;
        }
        local_ac = uVar9 * 2;
      }
      if (0 < (int)uVar9) {
        uVar6 = 0;
        do {
          bVar1 = pText[uVar6 + (long)iVar11];
          bVar8 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar8 = bVar1;
          }
          *(byte *)((long)p + uVar6) = bVar8;
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      iVar3 = (*xToken)(pCtx,0,(char *)p,uVar9,iVar11,iVar7);
      iVar11 = iVar10 + 2;
      bVar2 = true;
    }
LAB_001f4ce8:
  } while (bVar2);
  if (p != &local_78) {
    sqlite3_free(p);
  }
  iVar11 = 0;
  if (iVar3 != 0x65) {
    iVar11 = iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

static int fts5AsciiTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  AsciiTokenizer *p = (AsciiTokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  int ie;
  int is = 0;

  char aFold[64];
  int nFold = sizeof(aFold);
  char *pFold = aFold;
  unsigned char *a = p->aTokenChar;

  UNUSED_PARAM(iUnused);

  while( is<nText && rc==SQLITE_OK ){
    int nByte;

    /* Skip any leading divider characters. */
    while( is<nText && ((pText[is]&0x80)==0 && a[(int)pText[is]]==0) ){
      is++;
    }
    if( is==nText ) break;

    /* Count the token characters */
    ie = is+1;
    while( ie<nText && ((pText[ie]&0x80) || a[(int)pText[ie]] ) ){
      ie++;
    }

    /* Fold to lower case */
    nByte = ie-is;
    if( nByte>nFold ){
      if( pFold!=aFold ) sqlite3_free(pFold);
      pFold = sqlite3_malloc64((sqlite3_int64)nByte*2);
      if( pFold==0 ){
        rc = SQLITE_NOMEM;
        break;
      }
      nFold = nByte*2;
    }
    asciiFold(pFold, &pText[is], nByte);

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, pFold, nByte, is, ie);
    is = ie+1;
  }

  if( pFold!=aFold ) sqlite3_free(pFold);
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}